

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint64_t bitset_set_list_withcard(uint64_t *words,uint64_t card,uint16_t *list,uint64_t length)

{
  ushort *puVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  _Bool _Var5;
  uint64_t uVar6;
  
  _Var5 = croaring_avx2();
  if (_Var5) {
    if (length != 0) {
      puVar1 = list + length;
      do {
        uVar4 = *list >> 6;
        uVar2 = words[uVar4];
        uVar3 = (ulong)*list & 0x3f;
        words[uVar4] = uVar2 | 1L << uVar3;
        card = (card + 1) - (ulong)((uVar2 >> uVar3 & 1) != 0);
        list = list + 1;
      } while (puVar1 != list);
    }
    return card;
  }
  uVar6 = _scalar_bitset_set_list_withcard(words,card,list,length);
  return uVar6;
}

Assistant:

uint64_t bitset_set_list_withcard(uint64_t *words, uint64_t card,
                                  const uint16_t *list, uint64_t length) {
    if( croaring_avx2() ) {
        return _asm_bitset_set_list_withcard(words, card, list, length);
    } else {
        return _scalar_bitset_set_list_withcard(words, card, list, length);
    }
}